

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

int get_opaque_attr(attr_list l,atom_t attr_id,int *length_p,char **valp)

{
  int iVar1;
  attr_list in_RCX;
  undefined4 *in_RDX;
  int ret;
  attr_union v;
  attr_value_type t;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  attr_value_type *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  undefined4 local_4;
  
  iVar1 = query_pattr(in_RCX,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,
                      (attr_union *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else if (in_stack_ffffffffffffffd4 == 4) {
    *in_RDX = in_stack_ffffffffffffffc0;
    *(attr_value_type **)in_RCX = in_stack_ffffffffffffffc8;
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
get_opaque_attr(attr_list l, atom_t attr_id, int *length_p, char **valp)
{
    attr_value_type t;
    attr_union v;
    int ret = query_pattr(l, attr_id, &t, &v);
    if (ret == 0) return 0;
    switch(t) {
    case Attr_Opaque:
        *length_p = v.u.o.length;
	*valp = v.u.o.buffer;
	break;
    default:
	return 0;
    }
    return 1;
}